

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

QList<QByteArray> * __thiscall
QObject::dynamicPropertyNames(QList<QByteArray> *__return_storage_ptr__,QObject *this)

{
  QArrayDataPointer<QByteArray> *other;
  
  other = (QArrayDataPointer<QByteArray> *)(this->d_ptr).d[1]._vptr_QObjectData;
  if (other == (QArrayDataPointer<QByteArray> *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QArrayDataPointer<QByteArray>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QObject::dynamicPropertyNames() const
{
    Q_D(const QObject);
    if (d->extraData)
        return d->extraData->propertyNames;
    return QList<QByteArray>();
}